

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O2

Blob * __thiscall
jbcoin::STValidation::getSerialized(Blob *__return_storage_ptr__,STValidation *this)

{
  Serializer s;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  Serializer::Serializer((Serializer *)&local_30,0x100);
  STObject::add(&this->super_STObject,(Serializer *)&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Blob STValidation::getSerialized () const
{
    Serializer s;
    add (s);
    return s.peekData ();
}